

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O2

int jpc_cox_getcompparms
              (jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in,int prtflag,jpc_coxcp_t *compparms
              )

{
  byte *val;
  byte *val_00;
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  long lVar3;
  undefined8 uStack_38;
  uint_fast8_t tmp;
  
  val = (byte *)((long)&in->openmode_ + 1);
  uStack_38 = in_RAX;
  iVar1 = jpc_getuint8((jas_stream_t *)ms,val);
  if ((((iVar1 == 0) &&
       (iVar1 = jpc_getuint8((jas_stream_t *)ms,(uint_fast8_t *)((long)&in->openmode_ + 2)),
       iVar1 == 0)) &&
      (iVar1 = jpc_getuint8((jas_stream_t *)ms,(uint_fast8_t *)((long)&in->openmode_ + 3)),
      iVar1 == 0)) &&
     (iVar1 = jpc_getuint8((jas_stream_t *)ms,(uint_fast8_t *)&in->bufmode_), iVar1 == 0)) {
    val_00 = (byte *)((long)&in->bufmode_ + 1);
    iVar1 = jpc_getuint8((jas_stream_t *)ms,val_00);
    if (((iVar1 == 0) && (uVar2 = (uint)*val, uVar2 < 0x21)) && (*val_00 < 2)) {
      iVar1 = uVar2 + 1;
      in->flags_ = iVar1;
      if ((int)cstate != 0) {
        for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
          iVar1 = jpc_getuint8((jas_stream_t *)ms,&tmp);
          if (iVar1 != 0) {
            return -1;
          }
          in->tinybuf_[lVar3 * 2 + -0x28] = tmp & 0xf;
          in->tinybuf_[lVar3 * 2 + -0x27] = tmp >> 4;
          iVar1 = in->flags_;
        }
        *(byte *)&in->openmode_ = (byte)in->openmode_ | 1;
      }
      if ((ms->len & 1) == 0) {
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

static int jpc_cox_getcompparms(jpc_ms_t *ms, jpc_cstate_t *cstate,
  jas_stream_t *in, int prtflag, jpc_coxcp_t *compparms)
{
	uint_fast8_t tmp;
	int i;

	/* Eliminate compiler warning about unused variables. */
	(void)ms;
	(void)cstate;

	if (jpc_getuint8(in, &compparms->numdlvls) ||
	  jpc_getuint8(in, &compparms->cblkwidthval) ||
	  jpc_getuint8(in, &compparms->cblkheightval) ||
	  jpc_getuint8(in, &compparms->cblksty) ||
	  jpc_getuint8(in, &compparms->qmfbid)) {
		return -1;
	}
	if (compparms->numdlvls > 32) {
		goto error;
	}
	if (compparms->qmfbid != JPC_COX_INS &&
	    compparms->qmfbid != JPC_COX_RFT)
		goto error;
	compparms->numrlvls = compparms->numdlvls + 1;
	if (compparms->numrlvls > JPC_MAXRLVLS) {
		goto error;
	}
	if (prtflag) {
		for (i = 0; i < compparms->numrlvls; ++i) {
			if (jpc_getuint8(in, &tmp)) {
				goto error;
			}
			compparms->rlvls[i].parwidthval = tmp & 0xf;
			compparms->rlvls[i].parheightval = (tmp >> 4) & 0xf;
		}
		/* Sigh.
		This bit should be in the same field in both COC and COD mrk segs. */
		compparms->csty |= JPC_COX_PRT;
	}
	if (jas_stream_eof(in)) {
		goto error;
	}
	return 0;
error:
	jpc_cox_destroycompparms(compparms);
	return -1;
}